

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

cmSourceFile * __thiscall cmTarget::AddSource(cmTarget *this,string *src)

{
  cmTargetInternals *pcVar1;
  undefined1 auVar2 [8];
  __normal_iterator<cmTargetInternals::TargetPropertyEntry_**,_std::vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>_>
  _Var3;
  size_type sVar4;
  cmSourceFile *pcVar5;
  cmCompiledGeneratorExpression *x;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  auto_ptr<cmCompiledGeneratorExpression> local_b0;
  undefined1 local_a8 [8];
  cmListFileBacktrace lfbt;
  cmSourceFileLocation sfl;
  
  cmSourceFileLocation::cmSourceFileLocation(&sfl,this->Makefile,src);
  pcVar1 = (this->Internal).Pointer;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<cmTargetInternals::TargetPropertyEntry**,std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>,__gnu_cxx::__ops::_Iter_pred<TargetPropertyEntryFinder>>
                    ((pcVar1->SourceEntries).
                     super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pcVar1->SourceEntries).
                     super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&sfl);
  pcVar1 = (this->Internal).Pointer;
  if (_Var3._M_current ==
      (pcVar1->SourceEntries).
      super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
    ::clear(&(pcVar1->SourceFilesMap)._M_t);
    this->LinkImplementationLanguageIsContextDependent = true;
    cmMakefile::GetBacktrace(&lfbt,this->Makefile);
    cmGeneratorExpression::cmGeneratorExpression(&ge,&lfbt);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_a8,(string *)&ge);
    auVar2 = local_a8;
    local_a8 = (undefined1  [8])0x0;
    cge.x_ = (cmCompiledGeneratorExpression *)auVar2;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_a8);
    *(bool *)((long)auVar2 + 0x188) = true;
    pcVar1 = (this->Internal).Pointer;
    local_a8 = (undefined1  [8])operator_new(0x10);
    cge.x_ = (cmCompiledGeneratorExpression *)0x0;
    local_b0.x_ = (cmCompiledGeneratorExpression *)0x0;
    (((cmCompiledGeneratorExpression *)local_a8)->Backtrace).
    super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)auVar2;
    (((cmCompiledGeneratorExpression *)local_a8)->Backtrace).
    super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
    std::
    vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
    ::emplace_back<cmTargetInternals::TargetPropertyEntry*>
              ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                *)&pcVar1->SourceEntries,(TargetPropertyEntry **)local_a8);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_b0);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
    std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
              (&lfbt.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  }
  sVar4 = cmGeneratorExpression::Find(src);
  if (sVar4 == 0xffffffffffffffff) {
    pcVar5 = cmMakefile::GetOrCreateSource(this->Makefile,src,false);
  }
  else {
    pcVar5 = (cmSourceFile *)0x0;
  }
  cmSourceFileLocation::~cmSourceFileLocation(&sfl);
  return pcVar5;
}

Assistant:

cmSourceFile* cmTarget::AddSource(const std::string& src)
{
  cmSourceFileLocation sfl(this->Makefile, src);
  if (std::find_if(this->Internal->SourceEntries.begin(),
                   this->Internal->SourceEntries.end(),
                   TargetPropertyEntryFinder(sfl))
                                      == this->Internal->SourceEntries.end())
    {
    this->Internal->SourceFilesMap.clear();
    this->LinkImplementationLanguageIsContextDependent = true;
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(src);
    cge->SetEvaluateForBuildsystem(true);
    this->Internal->SourceEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  if (cmGeneratorExpression::Find(src) != std::string::npos)
    {
    return 0;
    }
  return this->Makefile->GetOrCreateSource(src);
}